

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complexwidgets.cpp
# Opt level: O3

QString * __thiscall
QAccessibleComboBox::text(QString *__return_storage_ptr__,QAccessibleComboBox *this,Text t)

{
  bool bVar1;
  QComboBox *this_00;
  QLineEdit *this_01;
  char16_t *tmp_1;
  char16_t *pcVar2;
  QTypedArrayData<char16_t> *tmp;
  QArrayData *pQVar3;
  qsizetype qVar4;
  long in_FS_OFFSET;
  QKeySequence local_60 [8];
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
  this_00 = (QComboBox *)QMetaObject::cast((QObject *)&QComboBox::staticMetaObject);
  if (this_00 == (QComboBox *)0x0) goto LAB_00515a36;
  if (t == Name) {
LAB_005158fa:
    bVar1 = QComboBox::isEditable(this_00);
    if (bVar1) {
      this_01 = QComboBox::lineEdit(this_00);
      QLineEdit::text(&local_58,this_01);
      (__return_storage_ptr__->d).d = local_58.d.d;
      (__return_storage_ptr__->d).ptr = local_58.d.ptr;
      pcVar2 = local_58.d.ptr;
      pQVar3 = &(local_58.d.d)->super_QArrayData;
    }
    else {
      QComboBox::currentText(&local_58,this_00);
      (__return_storage_ptr__->d).d = local_58.d.d;
      (__return_storage_ptr__->d).ptr = local_58.d.ptr;
      pcVar2 = local_58.d.ptr;
      pQVar3 = &(local_58.d.d)->super_QArrayData;
    }
    local_58.d.ptr = (char16_t *)0x0;
    local_58.d.d = (Data *)0x0;
    (__return_storage_ptr__->d).size = local_58.d.size;
    qVar4 = local_58.d.size;
LAB_005159d9:
    if (qVar4 != 0) goto LAB_00515a36;
  }
  else {
    if (t == Accelerator) {
      QKeySequence::QKeySequence(local_60,0x1000015,0,0,0);
      QKeySequence::toString((SequenceFormat)&local_58);
      qVar4 = local_58.d.size;
      pcVar2 = local_58.d.ptr;
      pQVar3 = &(local_58.d.d)->super_QArrayData;
      (__return_storage_ptr__->d).d = local_58.d.d;
      local_58.d.d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = local_58.d.ptr;
      local_58.d.ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).size = local_58.d.size;
      local_58.d.size = 0;
      QKeySequence::~QKeySequence(local_60);
      goto LAB_005159d9;
    }
    if (t == Value) goto LAB_005158fa;
    pQVar3 = (QArrayData *)0x0;
    pcVar2 = (char16_t *)0x0;
  }
  QAccessibleWidget::text(&local_58,&this->super_QAccessibleWidget,t);
  (__return_storage_ptr__->d).d = local_58.d.d;
  (__return_storage_ptr__->d).ptr = local_58.d.ptr;
  (__return_storage_ptr__->d).size = local_58.d.size;
  local_58.d.size = 0;
  local_58.d.d = (Data *)pQVar3;
  local_58.d.ptr = pcVar2;
  if (pQVar3 != (QArrayData *)0x0) {
    LOCK();
    (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar3,2,0x10);
    }
  }
LAB_00515a36:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QString QAccessibleComboBox::text(QAccessible::Text t) const
{
    QString str;
    if (QComboBox *cBox = comboBox()) {
        switch (t) {
        case QAccessible::Name:
#ifndef Q_OS_UNIX // on Linux we use relations for this, name is text (fall through to Value)
        str = QAccessibleWidget::text(t);
        break;
#endif
        case QAccessible::Value:
            if (cBox->isEditable())
                str = cBox->lineEdit()->text();
            else
                str = cBox->currentText();
            break;
#ifndef QT_NO_SHORTCUT
        case QAccessible::Accelerator:
            str = QKeySequence(Qt::Key_Down).toString(QKeySequence::NativeText);
            break;
#endif
        default:
            break;
        }
        if (str.isEmpty())
            str = QAccessibleWidget::text(t);
    }
    return str;
}